

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O0

void DC8uvNoTop_SSE2(uint8_t *dst,uint8_t *left)

{
  uint8_t *in_stack_00000020;
  uint8_t *in_stack_00000028;
  
  DC8uvNoLeft_SSE2(in_stack_00000028,in_stack_00000020);
  return;
}

Assistant:

static void DC8uvNoTop_SSE2(uint8_t* dst) {  // DC with no top samples
  int dc0 = 4;
  int i;
  for (i = 0; i < 8; ++i) {
    dc0 += dst[-1 + i * BPS];
  }
  Put8x8uv_SSE2(dc0 >> 3, dst);
}